

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
(anonymous_namespace)::FileSetType::WriteProperties<char_const*>
          (FileSetType *this,cmTarget *tgt,cmTargetInternals *impl,string *prop,char *value,
          bool clear)

{
  cmMakefile *pcVar1;
  string_view fileSetType;
  string_view sVar2;
  char *pcVar3;
  string *psVar4;
  cmTargetInternals *pcVar5;
  bool bVar6;
  ulong uVar7;
  cmAlphaNum local_588;
  size_t local_558;
  undefined8 uStack_550;
  cmAlphaNum local_548;
  string local_518;
  size_t local_4f8;
  undefined8 local_4f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_4e8;
  cmAlphaNum local_4d8;
  size_t local_4a8;
  undefined8 uStack_4a0;
  cmAlphaNum local_498;
  string local_468;
  size_t local_448;
  undefined8 local_440;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_438;
  cmAlphaNum local_428;
  size_t local_3f8;
  undefined8 uStack_3f0;
  cmAlphaNum local_3e8;
  string local_3b8;
  string_view local_398;
  size_t local_388;
  char *pcStack_380;
  cmAlphaNum local_378;
  size_t local_348;
  undefined8 uStack_340;
  cmAlphaNum local_338;
  string local_308;
  undefined1 local_2e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName_1;
  cmAlphaNum local_2a8;
  size_t local_278;
  undefined8 uStack_270;
  cmAlphaNum local_268;
  string local_238;
  string_view local_218;
  size_t local_208;
  char *pcStack_200;
  cmAlphaNum local_1f8;
  size_t local_1c8;
  undefined8 uStack_1c0;
  cmAlphaNum local_1b8;
  string local_188;
  undefined1 local_168 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName;
  allocator<char> local_f9;
  string local_f8;
  size_t local_d8;
  undefined8 local_d0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_c8;
  size_t local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  allocator<char> local_81;
  string local_80;
  size_t local_60;
  undefined8 local_58;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_50;
  byte local_39;
  char *pcStack_38;
  bool clear_local;
  char *value_local;
  string *prop_local;
  cmTargetInternals *impl_local;
  cmTarget *tgt_local;
  FileSetType *this_local;
  
  local_39 = clear;
  pcStack_38 = value;
  value_local = (char *)prop;
  prop_local = (string *)impl;
  impl_local = (cmTargetInternals *)tgt;
  tgt_local = (cmTarget *)this;
  local_50 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
  local_60 = ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x10))->_M_len;
  local_58 = *(undefined8 *)(this + 0x18);
  bVar6 = std::operator==(local_50,*(basic_string_view<char,_std::char_traits<char>_> *)
                                    (this + 0x10));
  pcVar5 = impl_local;
  psVar4 = prop_local;
  if (bVar6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<cm::static_string_view,void>
              ((string *)&local_80,(static_string_view *)this,&local_81);
    local_a8 = *(undefined8 *)this;
    uStack_a0 = *(undefined8 *)(this + 8);
    local_b8 = ((string_view *)(this + 0x60))->_M_len;
    uStack_b0 = *(undefined8 *)(this + 0x68);
    cmTargetInternals::AddDirectoryToFileSet<char_const*>
              ((cmTargetInternals *)psVar4,(cmTarget *)pcVar5,&local_80,pcStack_38,
               *(string_view *)this,*(string_view *)(this + 0x60),(bool)(local_39 & 1));
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    this_local._7_1_ = 1;
  }
  else {
    local_c8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)value_local);
    local_d8 = ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x20))->_M_len;
    local_d0 = *(undefined8 *)(this + 0x28);
    bVar6 = std::operator==(local_c8,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      (this + 0x20));
    pcVar5 = impl_local;
    psVar4 = prop_local;
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)&local_f8,(static_string_view *)this,&local_f9);
      cmTargetInternals::AddPathToFileSet<char_const*>
                ((cmTargetInternals *)psVar4,(cmTarget *)pcVar5,&local_f8,pcStack_38,
                 *(string_view *)this,*(string_view *)(this + 0x60),(bool)(local_39 & 1));
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator(&local_f9);
      this_local._7_1_ = 1;
    }
    else {
      sVar2 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)value_local);
      fileSetName.field_2._8_8_ = ((string_view *)(this + 0x30))->_M_len;
      bVar6 = cmHasPrefix(sVar2,*(string_view *)(this + 0x30));
      pcVar3 = value_local;
      if (bVar6) {
        std::basic_string_view<char,_std::char_traits<char>_>::size
                  ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x30));
        std::__cxx11::string::substr((ulong)local_168,(ulong)pcVar3);
        uVar7 = std::__cxx11::string::empty();
        pcVar5 = impl_local;
        psVar4 = prop_local;
        pcVar3 = pcStack_38;
        if ((uVar7 & 1) == 0) {
          local_208 = *(size_t *)this;
          pcStack_200 = *(char **)(this + 8);
          local_278 = ((string_view *)(this + 0x70))->_M_len;
          uStack_270 = *(undefined8 *)(this + 0x78);
          cmAlphaNum::cmAlphaNum(&local_268,*(string_view *)(this + 0x70));
          cmAlphaNum::cmAlphaNum(&local_2a8," \"");
          cmStrCat<std::__cxx11::string,char[2]>
                    (&local_238,&local_268,&local_2a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     (char (*) [2])0xde515f);
          local_218 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_238)
          ;
          sVar2._M_str = pcStack_200;
          sVar2._M_len = local_208;
          cmTargetInternals::AddDirectoryToFileSet<char_const*>
                    ((cmTargetInternals *)psVar4,(cmTarget *)pcVar5,(string *)local_168,pcVar3,sVar2
                     ,local_218,(bool)(local_39 & 1));
          std::__cxx11::string::~string((string *)&local_238);
        }
        else {
          pcVar1 = (cmMakefile *)prop_local->_M_string_length;
          local_1c8 = ((string_view *)(this + 0x70))->_M_len;
          uStack_1c0 = *(undefined8 *)(this + 0x78);
          cmAlphaNum::cmAlphaNum(&local_1b8,*(string_view *)(this + 0x70));
          cmAlphaNum::cmAlphaNum(&local_1f8," name cannot be empty.");
          cmStrCat<>(&local_188,&local_1b8,&local_1f8);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_188);
          std::__cxx11::string::~string((string *)&local_188);
        }
        this_local._7_1_ = 1;
        std::__cxx11::string::~string((string *)local_168);
      }
      else {
        sVar2 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)value_local);
        fileSetName_1.field_2._8_8_ = ((string_view *)(this + 0x40))->_M_len;
        bVar6 = cmHasPrefix(sVar2,*(string_view *)(this + 0x40));
        pcVar3 = value_local;
        if (bVar6) {
          std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x40));
          std::__cxx11::string::substr((ulong)local_2e8,(ulong)pcVar3);
          uVar7 = std::__cxx11::string::empty();
          pcVar5 = impl_local;
          psVar4 = prop_local;
          pcVar3 = pcStack_38;
          if ((uVar7 & 1) == 0) {
            local_388 = *(size_t *)this;
            pcStack_380 = *(char **)(this + 8);
            local_3f8 = ((string_view *)(this + 0x70))->_M_len;
            uStack_3f0 = *(undefined8 *)(this + 0x78);
            cmAlphaNum::cmAlphaNum(&local_3e8,*(string_view *)(this + 0x70));
            cmAlphaNum::cmAlphaNum(&local_428," \"");
            cmStrCat<std::__cxx11::string,char[2]>
                      (&local_3b8,&local_3e8,&local_428,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2e8,(char (*) [2])0xde515f);
            local_398 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_3b8);
            fileSetType._M_str = pcStack_380;
            fileSetType._M_len = local_388;
            cmTargetInternals::AddPathToFileSet<char_const*>
                      ((cmTargetInternals *)psVar4,(cmTarget *)pcVar5,(string *)local_2e8,pcVar3,
                       fileSetType,local_398,(bool)(local_39 & 1));
            std::__cxx11::string::~string((string *)&local_3b8);
          }
          else {
            pcVar1 = (cmMakefile *)prop_local->_M_string_length;
            local_348 = ((string_view *)(this + 0x70))->_M_len;
            uStack_340 = *(undefined8 *)(this + 0x78);
            cmAlphaNum::cmAlphaNum(&local_338,*(string_view *)(this + 0x70));
            cmAlphaNum::cmAlphaNum(&local_378," name cannot be empty.");
            cmStrCat<>(&local_308,&local_338,&local_378);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_308);
            std::__cxx11::string::~string((string *)&local_308);
          }
          this_local._7_1_ = 1;
          std::__cxx11::string::~string((string *)local_2e8);
        }
        else {
          local_438 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                      std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)value_local);
          local_448 = ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x80))->_M_len;
          local_440 = *(undefined8 *)(this + 0x88);
          bVar6 = std::operator==(local_438,
                                  *(basic_string_view<char,_std::char_traits<char>_> *)(this + 0x80)
                                 );
          if (bVar6) {
            pcVar1 = (cmMakefile *)prop_local->_M_string_length;
            local_4a8 = ((string_view *)(this + 0x80))->_M_len;
            uStack_4a0 = *(undefined8 *)(this + 0x88);
            cmAlphaNum::cmAlphaNum(&local_498,*(string_view *)(this + 0x80));
            cmAlphaNum::cmAlphaNum(&local_4d8," property is read-only\n");
            cmStrCat<>(&local_468,&local_498,&local_4d8);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_468);
            std::__cxx11::string::~string((string *)&local_468);
            this_local._7_1_ = 1;
          }
          else {
            local_4e8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)value_local);
            local_4f8 = ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0xa8))->_M_len;
            local_4f0 = *(undefined8 *)(this + 0xb0);
            bVar6 = std::operator==(local_4e8,
                                    *(basic_string_view<char,_std::char_traits<char>_> *)
                                     (this + 0xa8));
            if (bVar6) {
              pcVar1 = (cmMakefile *)prop_local->_M_string_length;
              local_558 = ((string_view *)(this + 0xa8))->_M_len;
              uStack_550 = *(undefined8 *)(this + 0xb0);
              cmAlphaNum::cmAlphaNum(&local_548,*(string_view *)(this + 0xa8));
              cmAlphaNum::cmAlphaNum(&local_588," property is read-only\n");
              cmStrCat<>(&local_518,&local_548,&local_588);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_518);
              std::__cxx11::string::~string((string *)&local_518);
              this_local._7_1_ = 1;
            }
            else {
              this_local._7_1_ = 0;
            }
          }
        }
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FileSetType::WriteProperties(cmTarget* tgt, cmTargetInternals* impl,
                                  const std::string& prop, ValueType value,
                                  bool clear)
{
  if (prop == this->DefaultDirectoryProperty) {
    impl->AddDirectoryToFileSet(tgt, std::string(this->TypeName), value,
                                this->TypeName, this->DefaultDescription,
                                clear);
    return true;
  }
  if (prop == this->DefaultPathProperty) {
    impl->AddPathToFileSet(tgt, std::string(this->TypeName), value,
                           this->TypeName, this->DefaultDescription, clear);
    return true;
  }
  if (cmHasPrefix(prop, this->DirectoryPrefix)) {
    auto fileSetName = prop.substr(this->DirectoryPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddDirectoryToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (cmHasPrefix(prop, this->PathPrefix)) {
    auto fileSetName = prop.substr(this->PathPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddPathToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (prop == this->SelfEntries.PropertyName) {
    impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(this->SelfEntries.PropertyName, " property is read-only\n"));
    return true;
  }
  if (prop == this->InterfaceEntries.PropertyName) {
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat(this->InterfaceEntries.PropertyName,
                                          " property is read-only\n"));
    return true;
  }
  return false;
}